

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::ConvertTo8Bit
               (Image16Bit *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  imageException *this;
  unsigned_short *puVar4;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_short>>
            (in,startXIn,startYIn,width,height);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,width,height);
  bVar1 = in->_colorCount;
  if (bVar1 == out->_colorCount) {
    uVar2 = in->_rowSize;
    uVar3 = out->_rowSize;
    puVar5 = out->_data + (ulong)(startXOut * bVar1) + (ulong)(startYOut * uVar3);
    puVar7 = puVar5 + height * uVar3;
    puVar4 = in->_data + (ulong)(startYIn * uVar2) + (ulong)startXIn;
    for (; puVar5 != puVar7; puVar5 = puVar5 + uVar3) {
      for (uVar6 = 0; width * bVar1 != uVar6; uVar6 = uVar6 + 1) {
        puVar5[uVar6] = *(uchar *)((long)puVar4 + uVar6 * 2 + 1);
      }
      puVar4 = puVar4 + uVar2;
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Color counts of images are different");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ConvertTo8Bit( const Image16Bit & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                        uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );
        ParameterValidation( out, startXOut, startYOut, width, height );
        if ( in.colorCount() != out.colorCount() )
            throw imageException( "Color counts of images are different" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = in.colorCount();

        const uint16_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t      * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for ( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint16_t * inX  = inY;
            uint8_t        * outX = outY;
            const uint8_t  * outXEnd = outX + width;

            for ( ; outX != outXEnd; ++outX, ++inX )
                *outX = (*inX) >> 8;
        }
    }